

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Instance * parse_impl(Instance *__return_storage_ptr__,char *filepath,ParsingFileExt ext)

{
  int iVar1;
  FILE *__stream;
  char *__s1;
  char *extstring;
  _Bool success;
  FILE *filehandle;
  ParsingFileExt ext_local;
  char *filepath_local;
  
  __stream = fopen(filepath,"r");
  memset(__return_storage_ptr__,0,0x48);
  __return_storage_ptr__->rounding_strat = CPTP_DIST_ROUND;
  extstring._7_1_ = false;
  filehandle._4_4_ = ext;
  if (ext == PARSING_FILE_EXT_AUTODETECT) {
    filehandle._4_4_ = PARSING_FILE_EXT_VRPLIB;
    __s1 = os_get_fext(filepath);
    if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,"simplified-vrp"), iVar1 == 0)) {
      filehandle._4_4_ = PARSING_FILE_EXT_SIMPLIFIED_VRP;
    }
  }
  if (__stream != (FILE *)0x0) {
    if (filehandle._4_4_ == PARSING_FILE_EXT_VRPLIB) {
      extstring._7_1_ = parse_vrp_file(__return_storage_ptr__,(FILE *)__stream,filepath);
    }
    else {
      if (filehandle._4_4_ != PARSING_FILE_EXT_SIMPLIFIED_VRP) {
        __assert_fail("!\"Invalid code path\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                      ,0x346,"Instance parse_impl(const char *, ParsingFileExt)");
      }
      extstring._7_1_ = parse_simplified_vrp_file(__return_storage_ptr__,(FILE *)__stream,filepath);
    }
    fclose(__stream);
  }
  if (extstring._7_1_ == false) {
    instance_destroy(__return_storage_ptr__);
  }
  else if ((__return_storage_ptr__->name == (char *)0x0) || (*__return_storage_ptr__->name == '\0'))
  {
    instance_set_name(__return_storage_ptr__,filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

static Instance parse_impl(const char *filepath, ParsingFileExt ext) {
    FILE *filehandle = fopen(filepath, "r");
    Instance result = {0};
    result.rounding_strat = CPTP_DIST_ROUND;
    bool success = false;

    if (ext == PARSING_FILE_EXT_AUTODETECT) {
        // Default to VRPLIB parsing
        ext = PARSING_FILE_EXT_VRPLIB;

        const char *extstring = os_get_fext(filepath);
        if (extstring && 0 == strcmp(extstring, "simplified-vrp")) {
            ext = PARSING_FILE_EXT_SIMPLIFIED_VRP;
        }
    }

    if (filehandle) {
        switch (ext) {
        case PARSING_FILE_EXT_SIMPLIFIED_VRP:
            success = parse_simplified_vrp_file(&result, filehandle, filepath);
            break;
        case PARSING_FILE_EXT_VRPLIB:
            success = parse_vrp_file(&result, filehandle, filepath);
            break;
        default:
            assert(!"Invalid code path");
            break;
        }
        fclose(filehandle);
    }

    if (success) {
        if (!result.name || result.name[0] == '\0') {
            instance_set_name(&result, filepath);
        }
        return result;
    } else {
        instance_destroy(&result);
        return result;
    }
}